

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.h
# Opt level: O3

void __thiscall FuncInfo::StartRecordingOutArgs(FuncInfo *this,uint argCount)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  this->outArgsDepth = this->outArgsDepth + 1;
  if (0xffff < argCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/FuncInfo.h"
                       ,0x25e,"(argCount == (Js::ArgSlot)argCount)",
                       "argCount == (Js::ArgSlot)argCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar5 = argCount + 1;
  uVar3 = (uVar5 & 0xffff) + this->outArgsCurrentExpr;
  this->outArgsCurrentExpr = uVar3;
  if ((uVar5 < 0x10000) && (uVar5 <= uVar3)) {
    if (uVar3 < this->outArgsMaxDepth) {
      uVar3 = this->outArgsMaxDepth;
    }
    this->outArgsMaxDepth = uVar3;
    return;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

void StartRecordingOutArgs(unsigned int argCount)
    {
#if DBG
        outArgsDepth++;
#endif
        // We should have checked for argCount overflow already
        Assert(argCount == (Js::ArgSlot)argCount);

        // Add one for the space to save the m_outParams pointer in InterpreterStackFrame::PushOut
        unsigned int outArgsCount = argCount + 1;
        outArgsCurrentExpr += (Js::ArgSlot)outArgsCount;

        // Check for overflow
        if ((Js::ArgSlot)outArgsCount != outArgsCount || outArgsCurrentExpr < outArgsCount)
        {
            Js::Throw::OutOfMemory();
        }
        outArgsMaxDepth = max(outArgsMaxDepth, outArgsCurrentExpr);
    }